

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O1

void __thiscall QVariantAnimationPrivate::updateInterpolator(QVariantAnimationPrivate *this)

{
  int interpolationType;
  int iVar1;
  Interpolator p_Var2;
  
  interpolationType = ::QVariant::typeId(&(this->currentInterval).start.second);
  iVar1 = ::QVariant::typeId(&(this->currentInterval).end.second);
  if (interpolationType == iVar1) {
    p_Var2 = getInterpolator(interpolationType);
  }
  else {
    p_Var2 = (Interpolator)0x0;
  }
  this->interpolator = p_Var2;
  if (p_Var2 == (Interpolator)0x0) {
    this->interpolator = defaultInterpolator;
  }
  return;
}

Assistant:

void QVariantAnimationPrivate::updateInterpolator()
{
    int type = currentInterval.start.second.userType();
    if (type == currentInterval.end.second.userType())
        interpolator = getInterpolator(type);
    else
        interpolator = nullptr;

    //we make sure that the interpolator is always set to something
    if (!interpolator)
        interpolator = &defaultInterpolator;
}